

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,Message *message)

{
  UnitTest *this_00;
  String local_58;
  undefined1 local_48 [8];
  TraceInfo trace;
  Message *message_local;
  int line_local;
  char *file_local;
  ScopedTrace *this_local;
  
  trace.message.length_ = (size_t)message;
  TraceInfo::TraceInfo((TraceInfo *)local_48);
  local_48 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  Message::GetString((Message *)&local_58);
  String::operator=((String *)&trace.line,&local_58);
  String::~String(&local_58);
  this_00 = UnitTest::GetInstance();
  UnitTest::PushGTestTrace(this_00,(TraceInfo *)local_48);
  TraceInfo::~TraceInfo((TraceInfo *)local_48);
  return;
}

Assistant:

ScopedTrace::ScopedTrace(const char* file, int line, const Message& message) {
  TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message = message.GetString();

  UnitTest::GetInstance()->PushGTestTrace(trace);
}